

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementInstancer.cpp
# Opt level: O0

ElementPtr __thiscall
Rml::ElementInstancerText::InstanceElement
          (ElementInstancerText *this,Element *param_1,String *tag,XMLAttributes *param_3)

{
  ElementInstancerPools *pEVar1;
  ElementText *__p;
  ElementText *ptr;
  XMLAttributes *param_3_local;
  String *tag_local;
  Element *param_1_local;
  ElementInstancerText *this_local;
  
  pEVar1 = ControlledLifetimeResource<Rml::ElementInstancerPools>::operator->
                     ((ControlledLifetimeResource<Rml::ElementInstancerPools> *)
                      element_instancer_pools);
  __p = Pool<Rml::ElementText>::AllocateAndConstruct<std::__cxx11::string_const&>
                  (&pEVar1->pool_text_default,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)param_3);
  ::std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>::
  unique_ptr<Rml::Releaser<Rml::Element>,void>
            ((unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>> *)this,&__p->super_Element);
  return (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
         (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)this;
}

Assistant:

ElementPtr ElementInstancerText::InstanceElement(Element* /*parent*/, const String& tag, const XMLAttributes& /*attributes*/)
{
	ElementText* ptr = element_instancer_pools->pool_text_default.AllocateAndConstruct(tag);
	return ElementPtr(static_cast<Element*>(ptr));
}